

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

bool re2::Regexp::SimplifyRegexp(StringPiece *src,ParseFlags flags,string *dst,RegexpStatus *status)

{
  string local_60;
  Regexp *local_40;
  Regexp *sre;
  Regexp *re;
  RegexpStatus *status_local;
  string *dst_local;
  StringPiece *pSStack_18;
  ParseFlags flags_local;
  StringPiece *src_local;
  
  re = (Regexp *)status;
  status_local = (RegexpStatus *)dst;
  dst_local._4_4_ = flags;
  pSStack_18 = src;
  sre = Parse(src,flags,status);
  if (sre == (Regexp *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    local_40 = Simplify(sre);
    Decref(sre);
    if (local_40 == (Regexp *)0x0) {
      if (re != (Regexp *)0x0) {
        RegexpStatus::set_code((RegexpStatus *)re,kRegexpInternalError);
        RegexpStatus::set_error_arg((RegexpStatus *)re,pSStack_18);
      }
      src_local._7_1_ = false;
    }
    else {
      ToString_abi_cxx11_(&local_60,local_40);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)status_local,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      Decref(local_40);
      src_local._7_1_ = true;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool Regexp::SimplifyRegexp(const StringPiece& src, ParseFlags flags,
                            std::string* dst, RegexpStatus* status) {
  Regexp* re = Parse(src, flags, status);
  if (re == NULL)
    return false;
  Regexp* sre = re->Simplify();
  re->Decref();
  if (sre == NULL) {
    if (status) {
      status->set_code(kRegexpInternalError);
      status->set_error_arg(src);
    }
    return false;
  }
  *dst = sre->ToString();
  sre->Decref();
  return true;
}